

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

void deqp::gles3::Functional::evalTexture2DShadowOffsetBias(ShaderEvalContext *c,TexLookupParams *p)

{
  float s;
  float t;
  float fVar1;
  float fVar2;
  float *pfVar3;
  float fVar4;
  undefined1 local_20 [16];
  TexLookupParams *p_local;
  ShaderEvalContext *c_local;
  
  local_20._8_8_ = p;
  p_local = (TexLookupParams *)c;
  pfVar3 = tcu::Vector<float,_4>::z(c->in);
  fVar4 = *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(p_local + 1));
  s = *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(p_local + 1));
  t = *pfVar3;
  fVar1 = *(float *)local_20._8_8_;
  pfVar3 = tcu::Vector<float,_4>::x(&p_local[1].scale);
  fVar2 = *pfVar3;
  tcu::Vector<int,_3>::swizzle((Vector<int,_3> *)local_20,(int)local_20._8_8_ + 4,0);
  fVar4 = texture2DShadowOffset(c,fVar4,s,t,fVar1 + fVar2,(IVec2 *)local_20);
  pfVar3 = tcu::Vector<float,_4>::x(&p_local[10].scale);
  *pfVar3 = fVar4;
  return;
}

Assistant:

static void		evalTexture2DShadowOffsetBias	(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture2DShadowOffset(c, c.in[0].z(), c.in[0].x(), c.in[0].y(), p.lod+c.in[1].x(), p.offset.swizzle(0,1)); }